

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix::Matrix(Matrix *this,int n,int m,int item)

{
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<Fraction,_std::allocator<Fraction>_> local_48;
  Fraction local_30;
  
  this->n_ = n;
  this->m_ = m;
  Fraction::Fraction(&local_30,item);
  std::vector<Fraction,_std::allocator<Fraction>_>::vector
            ((vector<Fraction,_std::allocator<Fraction>_> *)&local_48,(long)m,&local_30,&local_49);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&this->elements_,(long)n,(value_type *)&local_48,&local_4a);
  std::_Vector_base<Fraction,_std::allocator<Fraction>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

Matrix::Matrix(int n, int m, int item)
    : n_(n), m_(m),
      elements_(std::vector<std::vector<Fraction>>(n, std::vector<Fraction>(m, item))) {}